

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS ref_shard_mark_n(REF_SHARD ref_shard,REF_INT *face_marks,REF_INT *hex_marks)

{
  REF_FACE pRVar1;
  REF_CELL ref_cell;
  REF_STATUS RVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  REF_BOOL marked13;
  REF_BOOL marked02;
  REF_BOOL marked25;
  REF_BOOL marked16;
  REF_BOOL marked05;
  REF_BOOL marked14;
  REF_INT hex_nodes [27];
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  REF_INT local_98;
  REF_INT local_94;
  REF_INT local_90;
  
  *face_marks = 0;
  pRVar1 = ref_shard->face;
  iVar4 = 0;
  for (lVar5 = 0; lVar5 < pRVar1->n; lVar5 = lVar5 + 1) {
    if (ref_shard->mark[lVar5] != 0) {
      iVar4 = iVar4 + 1;
      *face_marks = iVar4;
    }
  }
  *hex_marks = 0;
  iVar4 = 0;
  do {
    ref_cell = ref_shard->grid->cell[0xb];
    if (ref_cell->max <= iVar4) {
      return 0;
    }
    RVar2 = ref_cell_nodes(ref_cell,iVar4,&local_a8);
    if (RVar2 == 0) {
      uVar3 = ref_shard_marked(ref_shard,local_a4,local_98,&local_ac);
      if (uVar3 != 0) {
        pcVar7 = "1-4";
        uVar6 = 0x8c;
LAB_0015c2af:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               uVar6,"ref_shard_mark_n",(ulong)uVar3,pcVar7);
        return uVar3;
      }
      uVar3 = ref_shard_marked(ref_shard,local_a8,local_94,&local_b0);
      if (uVar3 != 0) {
        pcVar7 = "0-5";
        uVar6 = 0x8e;
        goto LAB_0015c2af;
      }
      if (local_b0 != 0 || local_ac != 0) {
        *hex_marks = *hex_marks + 1;
      }
      uVar3 = ref_shard_marked(ref_shard,local_a4,local_90,&local_b4);
      if (uVar3 != 0) {
        pcVar7 = "1-6";
        uVar6 = 0x93;
        goto LAB_0015c2af;
      }
      uVar3 = ref_shard_marked(ref_shard,local_a0,local_94,&local_b8);
      if (uVar3 != 0) {
        pcVar7 = "2-5";
        uVar6 = 0x95;
        goto LAB_0015c2af;
      }
      if (local_b8 != 0 || local_b4 != 0) {
        *hex_marks = *hex_marks + 1;
      }
      uVar3 = ref_shard_marked(ref_shard,local_a8,local_a0,&local_bc);
      if (uVar3 != 0) {
        pcVar7 = "0-2";
        uVar6 = 0x9a;
        goto LAB_0015c2af;
      }
      uVar3 = ref_shard_marked(ref_shard,local_a4,local_9c,&local_c0);
      if (uVar3 != 0) {
        pcVar7 = "1-3";
        uVar6 = 0x9c;
        goto LAB_0015c2af;
      }
      if (local_c0 != 0 || local_bc != 0) {
        *hex_marks = *hex_marks + 1;
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_shard_mark_n(REF_SHARD ref_shard, REF_INT *face_marks,
                                    REF_INT *hex_marks) {
  REF_INT face;
  REF_INT cell, hex_nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL marked14, marked05;
  REF_BOOL marked16, marked25;
  REF_BOOL marked02, marked13;

  (*face_marks) = 0;

  for (face = 0; face < ref_face_n(ref_shard_face(ref_shard)); face++)
    if (0 != ref_shard_mark(ref_shard, face)) (*face_marks)++;

  (*hex_marks) = 0;
  each_ref_cell_valid_cell_with_nodes(ref_grid_hex(ref_shard_grid(ref_shard)),
                                      cell, hex_nodes) {
    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[4], &marked14),
        "1-4");
    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[5], &marked05),
        "0-5");

    if (marked14 || marked05) (*hex_marks)++;

    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[6], &marked16),
        "1-6");
    RSS(ref_shard_marked(ref_shard, hex_nodes[2], hex_nodes[5], &marked25),
        "2-5");

    if (marked16 || marked25) (*hex_marks)++;

    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[2], &marked02),
        "0-2");
    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[3], &marked13),
        "1-3");

    if (marked02 || marked13) (*hex_marks)++;
  }

  return REF_SUCCESS;
}